

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

strbuf * ssh_cipher_decrypt_wrapper(ssh_cipher *c,ptrlen input)

{
  ssh_cipheralg *psVar1;
  strbuf *psVar2;
  strbuf *sb;
  ssh_cipher *c_local;
  ptrlen input_local;
  
  psVar1 = ssh_cipher_alg(c);
  if (input.len % (ulong)(long)psVar1->blksize != 0) {
    psVar1 = ssh_cipher_alg(c);
    fatal_error("ssh_cipher_decrypt: needs a multiple of %d bytes",(ulong)(uint)psVar1->blksize);
  }
  psVar2 = strbuf_dup(input);
  ssh_cipher_decrypt(c,psVar2->u,(int)psVar2->len);
  return psVar2;
}

Assistant:

strbuf *ssh_cipher_decrypt_wrapper(ssh_cipher *c, ptrlen input)
{
    if (input.len % ssh_cipher_alg(c)->blksize)
        fatal_error("ssh_cipher_decrypt: needs a multiple of %d bytes",
                    ssh_cipher_alg(c)->blksize);
    strbuf *sb = strbuf_dup(input);
    ssh_cipher_decrypt(c, sb->u, sb->len);
    return sb;
}